

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Underwater_Acoustic_PDU *this)

{
  pointer pSVar1;
  pointer pAVar2;
  pointer pUVar3;
  ostream *poVar4;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  pointer pAVar5;
  pointer pUVar6;
  pointer pSVar7;
  KStringStream ss;
  KString KStack_2b8;
  KString local_298;
  KString local_278;
  KString local_258;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&KStack_2b8,&this->super_Header);
  poVar4 = std::operator<<(local_1a8,(string *)&KStack_2b8);
  poVar4 = std::operator<<(poVar4,"-Underwater Acoustic PDU-\n");
  poVar4 = std::operator<<(poVar4,"Emitting Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f8,&this->m_EmittingEntityID);
  UTILS::IndentString(&local_1d8,&local_1f8,Tabs,in_CL);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
  poVar4 = std::operator<<(poVar4,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_238,&this->m_EventID);
  UTILS::IndentString(&local_218,&local_238,Tabs_00,in_CL);
  poVar4 = std::operator<<(poVar4,(string *)&local_218);
  poVar4 = std::operator<<(poVar4,"State Update Indicator:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringStateUpdateIndicator_abi_cxx11_
            (&local_258,(ENUMS *)(ulong)this->m_ui8StateUpdateIndicator,Value);
  poVar4 = std::operator<<(poVar4,(string *)&local_258);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"Passive Parameter Index: ");
  DATA_TYPE::ENUMS::GetEnumAsStringPassiveParameterIndex_abi_cxx11_
            (&local_278,(ENUMS *)(ulong)this->m_ui16PassiveParamIndex,Value_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"Prop Plant Config:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringPropulsionPlantConfiguration_abi_cxx11_
            (&local_298,(ENUMS *)(ulong)this->m_ui8PropPlantConfig,Value_01);
  poVar4 = std::operator<<(poVar4,(string *)&local_298);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"Number Of Shafts:        ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ushort)this->m_ui8NumShafts);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"Number Of APA:           ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ushort)this->m_ui8NumAPA);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"Number Of UAES:          ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ushort)this->m_ui8NumEmitterSys);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&KStack_2b8);
  pSVar1 = (this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar7 = (this->m_vShafts).
                super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
    (*(pSVar7->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_2b8,pSVar7);
    std::operator<<(local_1a8,(string *)&KStack_2b8);
    std::__cxx11::string::~string((string *)&KStack_2b8);
  }
  pAVar2 = (this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pAVar5 = (this->m_vAPA).
                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
                _M_impl.super__Vector_impl_data._M_start; pAVar5 != pAVar2; pAVar5 = pAVar5 + 1) {
    (*(pAVar5->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_2b8,pAVar5);
    std::operator<<(local_1a8,(string *)&KStack_2b8);
    std::__cxx11::string::~string((string *)&KStack_2b8);
  }
  pUVar3 = (this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pUVar6 = (this->m_vUAES).
                super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pUVar6 != pUVar3; pUVar6 = pUVar6 + 1) {
    (*(pUVar6->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_2b8,pUVar6);
    std::operator<<(local_1a8,(string *)&KStack_2b8);
    std::__cxx11::string::~string((string *)&KStack_2b8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Underwater_Acoustic_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Underwater Acoustic PDU-\n"
       << "Emitting Entity ID:\n"
       << IndentString( m_EmittingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "State Update Indicator:  " << GetEnumAsStringStateUpdateIndicator( m_ui8StateUpdateIndicator )    << "\n"
       << "Passive Parameter Index: " << GetEnumAsStringPassiveParameterIndex( m_ui16PassiveParamIndex )     << "\n"
       << "Prop Plant Config:       " << GetEnumAsStringPropulsionPlantConfiguration( m_ui8PropPlantConfig ) << "\n"
       << "Number Of Shafts:        " << ( KUINT16 )m_ui8NumShafts               << "\n"
       << "Number Of APA:           " << ( KUINT16 )m_ui8NumAPA                  << "\n"
       << "Number Of UAES:          " << ( KUINT16 )m_ui8NumEmitterSys           << "\n";

    vector<Shaft>::const_iterator citrShafts = m_vShafts.begin();
    vector<Shaft>::const_iterator citrShaftsEnd = m_vShafts.end();
    for( ; citrShafts != citrShaftsEnd; ++citrShafts )
    {
        ss << citrShafts->GetAsString();
    }

    vector<APA>::const_iterator citrAPA =  m_vAPA.begin();
    vector<APA>::const_iterator citrAPAEnd =  m_vAPA.end();
    for( ; citrAPA != citrAPAEnd; ++citrAPA )
    {
        ss << citrAPA->GetAsString();
    }

    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAES = m_vUAES.begin();
    vector<UnderwaterAcousticEmitterSystem>::const_iterator citrUAESEnd = m_vUAES.end();
    for( ; citrUAES != citrUAESEnd; ++citrUAES )
    {
        ss << citrUAES->GetAsString();
    }

    return ss.str();
}